

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
     ::serialize<OutputStream>
               (unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                *s,OutputStream *ostream)

{
  _Hash_node_base *p_Var1;
  undefined1 local_14 [4];
  
  std::ostream::write((char *)(ostream->stream + 0x10),(long)local_14);
  for (p_Var1 = (s->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    BuiltinSerializer<std::pair<int_const,char>,void>::serialize_elems<OutputStream,0ul,1ul>
              (p_Var1 + 1,ostream);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }